

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O3

void Abc_SclDnsizePrint(SC_Man *p,int Iter,int nAttempts,int nOverlaps,int nChanges,int fVerbose)

{
  int iVar1;
  long lVar2;
  timespec ts;
  timespec local_38;
  
  if (Iter == -1) {
    printf("Total : ");
  }
  else {
    printf("%5d : ");
  }
  printf("Try =%6d  ",(ulong)(uint)nAttempts);
  printf("Over =%6d  ",(ulong)(uint)nOverlaps);
  printf("Fail =%6d  ",(ulong)(uint)(nAttempts - (nOverlaps + nChanges)));
  printf("Win =%6d  ",(ulong)(uint)nChanges);
  printf("A: ");
  printf("%.2f ",(double)p->SumArea);
  printf("(%+5.1f %%)  ",((double)(p->SumArea - p->SumArea0) * 100.0) / (double)p->SumArea0);
  printf("D: ");
  printf("%.2f ps ",(double)p->MaxDelay);
  printf("(%+5.1f %%)  ",((double)(p->MaxDelay - p->MaxDelay0) * 100.0) / (double)p->MaxDelay0);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = -1;
  }
  else {
    lVar2 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  printf("%8.2f sec    ",(double)(lVar2 - p->timeTotal) / 1000000.0);
  putchar((uint)(fVerbose == 0) * 3 + 10);
  return;
}

Assistant:

void Abc_SclDnsizePrint( SC_Man * p, int Iter, int nAttempts, int nOverlaps, int nChanges, int fVerbose )
{
    if ( Iter == -1 )
        printf( "Total : " );
    else
        printf( "%5d : ",    Iter );
    printf( "Try =%6d  ",    nAttempts );
    printf( "Over =%6d  ",   nOverlaps );
    printf( "Fail =%6d  ",   nAttempts-nOverlaps-nChanges );
    printf( "Win =%6d  ",    nChanges );
    printf( "A: " );
    printf( "%.2f ",         p->SumArea );
    printf( "(%+5.1f %%)  ", 100.0 * (p->SumArea - p->SumArea0)/ p->SumArea0 );
    printf( "D: " );
    printf( "%.2f ps ",      p->MaxDelay );
    printf( "(%+5.1f %%)  ", 100.0 * (p->MaxDelay - p->MaxDelay0)/ p->MaxDelay0 );
    printf( "%8.2f sec    ", 1.0*(Abc_Clock() - p->timeTotal)/(CLOCKS_PER_SEC) );
    printf( "%c", fVerbose ? '\n' : '\r' );
}